

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsMeshAddDomains(FmsMesh mesh,char *domain_name,FmsInt num_domains,FmsDomain **domains)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  char **__ptr;
  char *__ptr_00;
  FmsDomain pFVar4;
  ulong uVar5;
  ulong uVar6;
  FmsInt FVar7;
  FmsDomain *local_68;
  FmsInt *local_48;
  
  if (mesh == (FmsMesh)0x0) {
    return 1;
  }
  if (domain_name == (char *)0x0) {
    return 2;
  }
  if (domains == (FmsDomain **)0x0) {
    return 3;
  }
  uVar1 = mesh->num_domain_names;
  __ptr = mesh->domain_names;
  if (uVar1 != 0) {
    uVar6 = 0;
    do {
      iVar2 = strcmp(domain_name,__ptr[uVar6]);
      if (iVar2 == 0) {
        return 4;
      }
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  local_48 = mesh->domain_offsets;
  uVar6 = 1;
  do {
    uVar3 = uVar6;
    uVar6 = uVar3 * 2;
  } while (uVar3 < uVar1 + 1);
  if (uVar1 <= uVar3 >> 1) {
    __ptr = (char **)realloc(__ptr,uVar3 * 8);
    if (__ptr == (char **)0x0) {
      return 5;
    }
    mesh->domain_names = __ptr;
    local_48 = (FmsInt *)realloc(local_48,uVar3 * 8 + 8);
    if (local_48 == (FmsInt *)0x0) {
      return 5;
    }
    *local_48 = 0;
    mesh->domain_offsets = local_48;
  }
  uVar6 = mesh->num_domains;
  local_68 = mesh->domains;
  if (num_domains == 0) {
    __ptr_00 = strdup(domain_name);
    if (__ptr_00 == (char *)0x0) {
      return 5;
    }
  }
  else {
    uVar3 = 1;
    do {
      uVar5 = uVar3;
      uVar3 = uVar5 * 2;
    } while (uVar5 < uVar6 + num_domains);
    if (uVar6 <= uVar5 >> 1) {
      local_68 = (FmsDomain *)realloc(local_68,uVar5 << 3);
      if (local_68 == (FmsDomain *)0x0) {
        return 5;
      }
      mesh->domains = local_68;
    }
    __ptr_00 = strdup(domain_name);
    if (__ptr_00 == (char *)0x0) {
      return 5;
    }
    if (num_domains != 0) {
      FVar7 = 0;
      do {
        pFVar4 = (FmsDomain)calloc(1,0x138);
        if (pFVar4 == (FmsDomain)0x0) {
          for (; FVar7 != 0; FVar7 = FVar7 - 1) {
            free(local_68[uVar6 + (FVar7 - 1)]);
          }
          free(__ptr_00);
          return 5;
        }
        pFVar4->name = __ptr_00;
        pFVar4->id = FVar7;
        pFVar4->dim = 0x7f;
        local_68[uVar6 + FVar7] = pFVar4;
        FVar7 = FVar7 + 1;
      } while (num_domains != FVar7);
    }
  }
  __ptr[uVar1] = __ptr_00;
  mesh->num_domain_names = uVar1 + 1;
  local_48[uVar1 + 1] = num_domains + uVar6;
  mesh->num_domains = num_domains + uVar6;
  *domains = local_68 + uVar6;
  return 0;
}

Assistant:

int FmsMeshAddDomains(FmsMesh mesh, const char *domain_name, FmsInt num_domains,
                      FmsDomain **domains) {
  if (!mesh) { E_RETURN(1); }
  if (!domain_name) { E_RETURN(2); }
  if (!domains) { E_RETURN(3); }
  FmsInt num_domain_names = mesh->num_domain_names;
  char **domain_names = mesh->domain_names;
  // Make sure the 'domain_name' is not already used
  for (FmsInt i = 0; i < num_domain_names; i++) {
    if (strcmp(domain_name, domain_names[i]) == 0) { E_RETURN(4); }
  }
  FmsInt *domain_offsets = mesh->domain_offsets;
  // Reallocate mesh->domain_names and mesh->domain_offsets, if necessary
  FmsInt nc = NextPow2(num_domain_names+1);
  if (num_domain_names <= nc/2) {
    domain_names = realloc(domain_names, nc*sizeof(*domain_names));
    if (domain_names == NULL) { E_RETURN(5); }
    mesh->domain_names = domain_names;
    domain_offsets = realloc(domain_offsets, (nc+1)*sizeof(FmsInt));
    if (domain_offsets == NULL) { E_RETURN(5); }
    domain_offsets[0] = 0;
    mesh->domain_offsets = domain_offsets;
  }
  FmsDomain *m_domains = mesh->domains;
  const FmsInt m_num_domains = mesh->num_domains;
  // Reallocate mesh->domains, if necessary
  if (num_domains != 0) {
    nc = NextPow2(m_num_domains + num_domains);
    if (m_num_domains <= nc/2) {
      m_domains = realloc(m_domains, nc*sizeof(FmsDomain));
      if (m_domains == NULL) { E_RETURN(5); }
      mesh->domains = m_domains;
    }
  }
  char *domain_name_copy;
  if (FmsCopyString(domain_name, &domain_name_copy)) { E_RETURN(5); }
  // On error, call free(domain_name_copy)
  for (FmsInt i = 0; i < num_domains; i++) {
    FmsDomain domain;
    domain = calloc(1, sizeof(*domain));
    if (domain == NULL) {
      while (i != 0) { free(m_domains[m_num_domains + (--i)]); }
      free(domain_name_copy);
      E_RETURN(5);
    }
    // Init the domain name, id, and dim
    domain->name = domain_name_copy;
    domain->id = i;
    domain->dim = FMS_INVALID_DIM;
    m_domains[m_num_domains + i] = domain;
  }
  domain_names[num_domain_names] = domain_name_copy;
  mesh->num_domain_names = ++num_domain_names;
  mesh->num_domains = domain_offsets[num_domain_names] = m_num_domains +
                      num_domains;
  *domains = m_domains + m_num_domains;
  return 0;
}